

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O3

void Ntk_SymFunGenerate(int nVars,int fVerbose)

{
  int iVar1;
  undefined1 auVar2 [12];
  byte bVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int *pComp;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Vec_Int_t *p_00;
  ulong uVar11;
  word *pFun;
  size_t sVar12;
  uint *puVar13;
  word *pwVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  word wVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar39;
  char Ones [100];
  word **local_148;
  ulong local_140;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined4 local_38;
  long lVar27;
  
  auVar31._4_4_ = 0;
  auVar31._0_4_ = nVars;
  pComp = Extra_GreyCodeSchedule(nVars);
  bVar3 = (byte)nVars;
  bVar15 = bVar3 - 6;
  iVar1 = 1 << (bVar15 & 0x1f);
  if (nVars < 7) {
    iVar1 = 1;
  }
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar1;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  uVar20 = 9999;
  while( true ) {
    do {
      uVar7 = uVar20;
      uVar20 = uVar7 + 1;
    } while ((uVar7 & 1) != 0);
    if (uVar20 < 9) break;
    iVar16 = 5;
    while (uVar20 % (iVar16 - 2U) != 0) {
      uVar5 = iVar16 * iVar16;
      iVar16 = iVar16 + 2;
      if (uVar20 < uVar5) goto LAB_00319712;
    }
  }
LAB_00319712:
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar7) {
    uVar5 = uVar20;
  }
  pVVar9->nCap = uVar5;
  piVar10 = (int *)malloc((long)(int)uVar5 << 2);
  pVVar9->pArray = piVar10;
  pVVar9->nSize = uVar20;
  if (piVar10 != (int *)0x0) {
    memset(piVar10,0xff,(long)(int)uVar20 << 2);
  }
  p->vTable = pVVar9;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 10000;
  p_00->nSize = 0;
  piVar10 = (int *)malloc(40000);
  p_00->pArray = piVar10;
  p->vNexts = p_00;
  if (nVars - 0x11U < 0xfffffff0) {
    __assert_fail("!(nVars < 1 || nVars > 16)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                  ,0x13a,"void Ntk_SymFunGenerate(int, int)");
  }
  printf("Generating truth tables of all symmetric functions of %d variables.\n");
  iVar16 = nVars;
  if (nVars == 1) {
    iVar16 = 2;
  }
  iVar22 = 3;
  if (iVar16 != 2) {
    iVar22 = iVar16;
  }
  if (nVars < 7) {
    bVar15 = 0;
  }
  auVar31._8_4_ = nVars;
  auVar31._12_4_ = 0;
  iVar6 = nVars + -1;
  auVar33._4_4_ = iVar6;
  auVar33._0_4_ = iVar6;
  auVar33._8_4_ = iVar6;
  auVar33._12_4_ = iVar6;
  local_140 = 0xffffffff;
  auVar31 = auVar31 ^ _DAT_0093d220;
  auVar33 = auVar33 ^ _DAT_0093d220;
  local_148 = (word **)0x0;
  iVar6 = 0;
  uVar20 = 0;
  uVar21 = 0;
  do {
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_38 = 0;
    uVar11 = 0;
    auVar25 = _DAT_0093d210;
    do {
      bVar24 = auVar31._0_4_ < SUB164(auVar25 ^ _DAT_0093d220,0);
      iVar17 = SUB164(auVar25 ^ _DAT_0093d220,4);
      iVar32 = auVar31._4_4_;
      if ((bool)(~(iVar32 < iVar17 || iVar17 == iVar32 && bVar24) & 1)) {
        local_98[uVar11] = (uVar20 >> ((uint)uVar11 & 0x1f) & 1) != 0 | 0x30;
      }
      if (iVar32 >= iVar17 && (iVar17 != iVar32 || !bVar24)) {
        local_98[uVar11 + 1] = (uVar20 >> ((uint)uVar11 + 1 & 0x1f) & 1) != 0 | 0x30;
      }
      uVar11 = uVar11 + 2;
      lVar27 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar27 + 2;
    } while ((nVars + 2U & 0x3e) != uVar11);
    auVar38 = _DAT_0093d220;
    if (fVerbose != 0) {
      printf("%s : ",local_98);
    }
    pFun = (word *)calloc((long)iVar1,8);
    sVar12 = strlen(local_98);
    auVar4 = _DAT_0094a000;
    auVar25 = _DAT_0093d220;
    if (nVars + 1 != (int)sVar12) {
      __assert_fail("(int)strlen(pOnes) == nVars + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0xdad,"word *Abc_TtSymFunGenerate(char *, int)");
    }
    uVar7 = 0;
    local_a8 = auVar33._0_4_;
    iStack_a4 = auVar33._4_4_;
    iStack_a0 = auVar33._8_4_;
    iStack_9c = auVar33._12_4_;
    do {
      auVar30._4_4_ = uVar7;
      auVar30._0_4_ = uVar7;
      auVar30._8_4_ = uVar7;
      auVar30._12_4_ = uVar7;
      auVar36 = (undefined1  [16])0x0;
      auVar29 = auVar4;
      uVar5 = nVars + 3U & 0x3c;
      do {
        auVar26 = auVar29;
        auVar28 = auVar36;
        auVar29 = pshuflw(auVar28,auVar26,0xfe);
        auVar35 = pshuflw(auVar38,auVar26,0x54);
        auVar34._0_8_ = auVar26._8_8_;
        auVar34._8_4_ = auVar26._8_4_;
        auVar34._12_4_ = auVar26._12_4_;
        auVar36 = pshuflw(auVar35,auVar34,0xfe);
        uVar39 = uVar7 >> auVar36._0_8_;
        auVar38._12_4_ = uVar39;
        auVar38._8_4_ = uVar7 >> auVar36._0_8_;
        auVar36 = pshuflw(auVar34,auVar34,0x54);
        lVar27 = auVar36._0_8_;
        auVar2._4_8_ = auVar30._8_8_;
        auVar2._0_4_ = uVar7 >> lVar27;
        auVar37._0_8_ = auVar2._0_8_ << 0x20;
        auVar37._8_4_ = uVar7 >> lVar27;
        auVar37._12_4_ = uVar7 >> lVar27;
        auVar38._0_8_ = auVar37._8_8_;
        auVar36._0_4_ = (uVar7 >> auVar35._0_8_ & 1) + auVar28._0_4_;
        auVar36._4_4_ = (uVar7 >> auVar29._0_8_ & 1) + auVar28._4_4_;
        auVar36._8_4_ = (auVar37._8_4_ & 1) + auVar28._8_4_;
        auVar36._12_4_ = (uVar39 & 1) + auVar28._12_4_;
        auVar29._0_4_ = auVar26._0_4_ + 4;
        auVar29._4_4_ = auVar26._4_4_ + 4;
        auVar29._8_4_ = auVar26._8_4_ + 4;
        auVar29._12_4_ = auVar26._12_4_ + 4;
        uVar5 = uVar5 - 4;
      } while (uVar5 != 0);
      auVar26 = auVar26 ^ auVar25;
      auVar35._0_4_ = -(uint)(local_a8 < auVar26._0_4_);
      auVar35._4_4_ = -(uint)(iStack_a4 < auVar26._4_4_);
      auVar35._8_4_ = -(uint)(iStack_a0 < auVar26._8_4_);
      auVar35._12_4_ = -(uint)(iStack_9c < auVar26._12_4_);
      auVar36 = ~auVar35 & auVar36 | auVar28 & auVar35;
      if (local_98[(uint)(auVar36._12_4_ + auVar36._4_4_ + auVar36._8_4_ + auVar36._0_4_)] == '1') {
        pFun[uVar7 >> 6] = pFun[uVar7 >> 6] ^ 1L << ((byte)uVar7 & 0x3f);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 >> (bVar3 & 0x1f) == 0);
    if ((uint)nVars < 6) {
      wVar18 = (ulong)((uint)*pFun & 3) * 5;
      if (nVars != 1) {
        wVar18 = *pFun;
      }
      uVar7 = (uint)wVar18 & 0xf;
      uVar11 = (ulong)(uVar7 << 4 | uVar7);
      if (iVar16 != 2) {
        uVar11 = wVar18;
      }
      uVar19 = (ulong)(uint)((int)(uVar11 & 0xff) << 8) | uVar11 & 0xff;
      if (iVar22 != 3) {
        uVar19 = uVar11;
      }
      uVar11 = (ulong)((uint)uVar19 << 0x10 | (uint)uVar19 & 0xffff);
      if (1 < iVar22 - 3U) {
        uVar11 = uVar19;
      }
      *pFun = uVar11 << 0x20 | uVar11 & 0xffffffff;
    }
    if (fVerbose != 0) {
      Extra_PrintHex(_stdout,(uint *)pFun,nVars);
    }
    Ntk_SymFunDeriveNpn(pFun,nVars,pComp);
    uVar7 = (uint)uVar21;
    if (pVVar9->nSize < (int)uVar7) {
      uVar11 = (ulong)(pVVar9->nSize * 2 - 1);
      while( true ) {
        do {
          uVar5 = (uint)uVar11;
          uVar39 = uVar5 + 1;
          uVar23 = (ulong)uVar39;
          uVar19 = uVar11 & 1;
          uVar11 = uVar23;
        } while (uVar19 != 0);
        if (uVar39 < 9) break;
        iVar17 = 5;
        while (uVar39 % (iVar17 - 2U) != 0) {
          uVar8 = iVar17 * iVar17;
          iVar17 = iVar17 + 2;
          if (uVar39 < uVar8) goto LAB_00319bc9;
        }
      }
LAB_00319bc9:
      if (pVVar9->nCap < (int)uVar39) {
        if (pVVar9->pArray == (int *)0x0) {
          piVar10 = (int *)malloc((long)(int)uVar39 << 2);
        }
        else {
          piVar10 = (int *)realloc(pVVar9->pArray,(long)(int)uVar39 << 2);
        }
        pVVar9->pArray = piVar10;
        if (piVar10 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar9->nCap = uVar39;
      }
      if (uVar5 < 0x7fffffff) {
        memset(pVVar9->pArray,0xff,uVar23 << 2);
      }
      pVVar9->nSize = uVar39;
      p_00->nSize = 0;
      if ((int)uVar7 < 1) {
        uVar5 = 0;
      }
      else {
        pwVar14 = *local_148;
        if (pwVar14 == (word *)0x0) goto LAB_00319fb0;
        uVar5 = 1;
        do {
          pwVar14 = pwVar14 + (int)((uVar5 - 1 & 0xfff) << (bVar15 & 0x1f));
          piVar10 = Vec_MemHashLookup(p,pwVar14);
          if (*piVar10 != -1) {
            __assert_fail("*pSpot == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                          ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
          }
          *piVar10 = p_00->nSize;
          Vec_IntPush(p_00,(int)pwVar14);
          if (uVar7 == uVar5) break;
          pwVar14 = local_148[uVar5 >> 0xc];
          uVar5 = uVar5 + 1;
        } while (pwVar14 != (word *)0x0);
        uVar5 = p_00->nSize;
      }
      if (uVar7 != uVar5) {
LAB_00319fb0:
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
      }
    }
    pwVar14 = pFun;
    puVar13 = (uint *)Vec_MemHashLookup(p,pFun);
    if (*puVar13 == 0xffffffff) {
      *puVar13 = p_00->nSize;
      Vec_IntPush(p_00,(int)pwVar14);
      if ((int)uVar7 < 0) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
      }
      uVar11 = uVar21 >> 0xc;
      iVar17 = (int)uVar11;
      if ((int)local_140 < iVar17) {
        if (iVar6 <= iVar17) {
          iVar32 = iVar6 * 2;
          bVar24 = iVar6 != 0;
          iVar6 = iVar17 + 0x20;
          if (bVar24) {
            iVar6 = iVar32;
          }
          p->nPageAlloc = iVar6;
          if (local_148 == (word **)0x0) {
            local_148 = (word **)malloc((long)iVar6 * 8);
          }
          else {
            local_148 = (word **)realloc(local_148,(long)iVar6 * 8);
          }
          p->ppPages = local_148;
        }
        uVar19 = (long)(int)local_140;
        do {
          uVar23 = uVar19 + 1;
          pwVar14 = (word *)malloc((long)(iVar1 << 0xc) << 3);
          local_148[uVar19 + 1] = pwVar14;
          uVar19 = uVar23;
        } while (uVar11 != uVar23);
        p->iPage = iVar17;
        local_148 = p->ppPages;
        local_140 = uVar11;
      }
      uVar5 = uVar7 + 1;
      uVar19 = (ulong)uVar5;
      p->nEntries = uVar5;
      memmove(local_148[uVar11] + (int)((uVar7 & 0xfff) << (bVar15 & 0x1f)),pFun,(long)iVar1 * 8);
      uVar11 = uVar21;
      if (uVar5 != p_00->nSize) {
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
      }
    }
    else {
      uVar11 = (ulong)*puVar13;
      uVar19 = uVar21;
    }
    if (fVerbose != 0) {
      printf(" : NPN ");
      Extra_PrintHex(_stdout,(uint *)pFun,nVars);
      printf("  Class %3d",uVar11);
      putchar(10);
    }
    if (pFun != (word *)0x0) {
      free(pFun);
    }
    uVar20 = uVar20 + 1;
    uVar21 = uVar19;
    if (uVar20 == 2 << (bVar3 & 0x1f)) {
      printf("The number of different NPN classes is %d.\n",uVar19);
      if (pVVar9->pArray != (int *)0x0) {
        free(pVVar9->pArray);
      }
      free(pVVar9);
      p->vTable = (Vec_Int_t *)0x0;
      pVVar9 = p->vNexts;
      if (pVVar9 != (Vec_Int_t *)0x0) {
        if (pVVar9->pArray != (int *)0x0) {
          free(pVVar9->pArray);
        }
        free(pVVar9);
        p->vNexts = (Vec_Int_t *)0x0;
      }
      if (-1 < (int)local_140) {
        uVar21 = 0;
        do {
          if (local_148[uVar21] != (word *)0x0) {
            free(local_148[uVar21]);
            local_148[uVar21] = (word *)0x0;
          }
          uVar21 = uVar21 + 1;
        } while ((int)local_140 + 1 != uVar21);
        local_148 = p->ppPages;
      }
      if (local_148 != (word **)0x0) {
        free(local_148);
      }
      free(p);
      if (pComp != (int *)0x0) {
        free(pComp);
      }
      return;
    }
  } while( true );
}

Assistant:

void Ntk_SymFunGenerate( int nVars, int fVerbose )
{
    int k, m, Class;
    int * pComp = Extra_GreyCodeSchedule( nVars );
    Vec_Mem_t * vTtMem = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 );
    Vec_MemHashAlloc( vTtMem, 10000 );
    assert( !(nVars < 1 || nVars > 16) );
    printf( "Generating truth tables of all symmetric functions of %d variables.\n", nVars );
    for ( m = 0; m < (1 << (nVars+1)); m++ )
    {
        word * pFun;
        char Ones[100] = {0};
        for ( k = 0; k <= nVars; k++ )
            Ones[k] = '0' + ((m >> k) & 1);
        if ( fVerbose )
            printf( "%s : ", Ones );
        pFun = Abc_TtSymFunGenerate( Ones, nVars );
        if ( nVars < 6 )
            pFun[0] = Abc_Tt6Stretch( pFun[0], nVars );
        if ( fVerbose )
            Extra_PrintHex( stdout, (unsigned *)pFun, nVars );
        Ntk_SymFunDeriveNpn( pFun, nVars, pComp );
        Class = Vec_MemHashInsert( vTtMem, pFun );
        if ( fVerbose )
        {
            printf( " : NPN " );
            Extra_PrintHex( stdout, (unsigned *)pFun, nVars );
            printf( "  Class %3d", Class );
            printf( "\n" );
        }
        ABC_FREE( pFun );
    }
    printf( "The number of different NPN classes is %d.\n", Vec_MemEntryNum(vTtMem) );
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    ABC_FREE( pComp );
}